

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Column::Column(Column *this,string *text)

{
  string *text_local;
  Column *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_strings);
  this->m_width = 0x4f;
  this->m_indent = 0;
  this->m_initialIndent = 0xffffffffffffffff;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_strings,text);
  return;
}

Assistant:

explicit Column(std::string const& text) { m_strings.push_back(text); }